

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O3

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_wildcard_departure_set
          (CompositeATN<unsigned_char> *this,CATNDepartureSetFactory<unsigned_char> *deptset_factory
          ,Identifier *id,int color,PriorityChain *priority,ATNStateStack *stack)

{
  Identifier *id_00;
  pointer ppVar1;
  pointer pwVar2;
  bool bVar3;
  int iVar4;
  SimpleException *this_00;
  ulong uVar5;
  long lVar6;
  _Hash_node_base *p_Var7;
  int index;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  undefined1 local_50 [16];
  _func_int *local_40 [2];
  
  p_Var9 = (this->m_dict)._M_h._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    do {
      p_Var7 = p_Var9[7]._M_nxt;
      uVar5 = ((long)p_Var9[8]._M_nxt - (long)p_Var7 >> 4) * -0x3333333333333333;
      if (0 < (int)uVar5) {
        id_00 = (Identifier *)(p_Var9 + 1);
        lVar6 = 0x20;
        uVar8 = 0;
        do {
          if (uVar5 <= uVar8) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          bVar3 = Identifier::operator==((Identifier *)((long)&p_Var7->_M_nxt + lVar6),id);
          if (bVar3) {
            index = (int)uVar8;
            iVar4 = ATNPath::count(stack,id_00,index);
            if (1 < iVar4) {
              this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
              local_50._0_8_ = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,"Upward sentinel reached.","");
              SimpleException::SimpleException(this_00,(string *)local_50);
              __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
            }
            local_50._0_4_ = index;
            std::
            vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
            ::emplace_back<Centaurus::Identifier_const&,int&>
                      ((vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
                        *)&stack->
                           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ,id_00,(int *)local_50);
            ATNPath::ATNPath((ATNPath *)local_50,id_00,index);
            build_departure_set_r(this,deptset_factory,(ATNPath *)local_50,color,priority,stack);
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       *)(local_50 + 8));
            ppVar1 = (stack->
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ).
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            (stack->
            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ).
            super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
            ppVar1[-1].first._vptr_Identifier = (_func_int **)&PTR__Identifier_0019cd38;
            pwVar2 = ppVar1[-1].first.m_id._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)pwVar2 != &ppVar1[-1].first.m_id.field_2) {
              operator_delete(pwVar2);
            }
          }
          p_Var7 = p_Var9[7]._M_nxt;
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + 0x50;
          uVar5 = ((long)p_Var9[8]._M_nxt - (long)p_Var7 >> 4) * -0x3333333333333333;
        } while ((long)uVar8 < (long)(int)uVar5);
      }
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_wildcard_departure_set(CATNDepartureSetFactory<TCHAR>& deptset_factory, const Identifier& id, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    for (const auto& p : m_dict)
    {
        for (int i = 0; i < p.second.get_num_nodes(); i++)
        {
            if (p.second[i].get_submachine() == id)
            {
                if (stack.count(p.first, i) >= 2)
                {
                    //std::cout << "Upward sentinel reached." << std::endl;
                    throw SimpleException("Upward sentinel reached.");
                    //continue;
                }
                stack.push(p.first, i);
                build_departure_set_r(deptset_factory, ATNPath(p.first, i), color, priority, stack);
                stack.pop();
            }
        }
    }
}